

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

int ON_SubDComponentId::CompareTypeAndIdFromPointer(ON_SubDComponentId *lhs,ON_SubDComponentId *rhs)

{
  byte bVar1;
  byte bVar2;
  
  if (lhs == rhs) {
    return 0;
  }
  if (lhs == (ON_SubDComponentId *)0x0) {
    return 1;
  }
  if (rhs != (ON_SubDComponentId *)0x0) {
    bVar1 = lhs->m_type_and_dir & 6;
    bVar2 = rhs->m_type_and_dir & 6;
    if (bVar2 <= bVar1) {
      if (bVar2 < bVar1) {
        return 1;
      }
      if (lhs->m_id < rhs->m_id) {
        return -1;
      }
      return (uint)(rhs->m_id < lhs->m_id);
    }
  }
  return -1;
}

Assistant:

int ON_SubDComponentId::CompareTypeAndIdFromPointer(const ON_SubDComponentId* lhs, const ON_SubDComponentId* rhs)
{
  if (lhs == rhs)
    return 0;

  // nullptr sorts to end of list
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;

  // compare type
  const unsigned char lhs_type = (lhs->m_type_and_dir & ON_SubDComponentId::bits_type_mask);
  const unsigned char rhs_type = (rhs->m_type_and_dir & ON_SubDComponentId::bits_type_mask);
  if (lhs_type < rhs_type)
    return -1;
  if (lhs_type > rhs_type)
    return 1;

  // compare id
  if (lhs->m_id < rhs->m_id)
    return -1;
  if (lhs->m_id > rhs->m_id)
    return 1;

  return 0;
}